

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_thread.cpp
# Opt level: O0

void __thiscall zmq::io_thread_t::in_event(io_thread_t *this)

{
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  size_t in_RCX;
  long in_RDI;
  undefined8 in_R8;
  bool bVar4;
  char *errstr;
  int rc;
  command_t cmd;
  command_t *in_stack_ffffffffffffff10;
  object_t *in_stack_ffffffffffffff18;
  int local_c4;
  undefined1 local_c0 [184];
  
  sVar1 = mailbox_t::recv((mailbox_t *)(in_RDI + 0x20),(int)local_c0,(void *)0x0,in_RCX,(int)in_R8);
  local_c4 = (int)sVar1;
  while( true ) {
    bVar4 = true;
    if (local_c4 != 0) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 4;
    }
    if (!bVar4) break;
    if (local_c4 == 0) {
      object_t::process_command(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    }
    sVar1 = mailbox_t::recv((mailbox_t *)(in_RDI + 0x20),(int)local_c0,(void *)0x0,in_RCX,(int)in_R8
                           );
    local_c4 = (int)sVar1;
  }
  bVar4 = false;
  if (local_c4 != 0) {
    piVar2 = __errno_location();
    bVar4 = *piVar2 == 0xb;
  }
  if (!bVar4) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/io_thread.cpp"
            ,0x5f);
    fflush(_stderr);
    zmq_abort((char *)0x2b42ed);
  }
  return;
}

Assistant:

void zmq::io_thread_t::in_event ()
{
    //  TODO: Do we want to limit number of commands I/O thread can
    //  process in a single go?

    command_t cmd;
    int rc = _mailbox.recv (&cmd, 0);

    while (rc == 0 || errno == EINTR) {
        if (rc == 0)
            cmd.destination->process_command (cmd);
        rc = _mailbox.recv (&cmd, 0);
    }

    errno_assert (rc != 0 && errno == EAGAIN);
}